

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O2

void defyx::generateSuperscalar(SuperscalarProgram *prog,Blake2Generator *gen)

{
  byte bVar1;
  byte bVar2;
  type tVar3;
  type tVar4;
  bool bVar5;
  SuperscalarInstructionInfo *pSVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  pointer pMVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  uint8_t uVar17;
  undefined1 *this;
  uint cycle;
  int iVar18;
  int iVar19;
  uint local_970;
  int local_968;
  int local_944;
  int local_940;
  int local_93c;
  int local_938;
  int local_934;
  int local_930;
  SuperscalarInstruction currentInstruction;
  RegisterInfo *local_8f0;
  RegisterInfo registers [8];
  type portBusy [174] [3];
  
  lVar14 = 0;
  memset(portBusy,0,0x828);
  do {
    *(undefined8 *)((long)&registers[0].latency + lVar14) = 0xffffffff00000000;
    *(undefined8 *)((long)&registers[0].lastOpPar + lVar14) = 0xffffffff;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x80);
  currentInstruction._34_6_ = uRam0000000000124192;
  currentInstruction._32_2_ = DAT_00124190;
  currentInstruction.mod_ = _DAT_00124180;
  currentInstruction.imm32_ = DAT_00124180_4;
  currentInstruction.opGroup_ = (SuperscalarInstructionType)uRam0000000000124188;
  currentInstruction.opGroupPar_ = uRam0000000000124188._4_4_;
  currentInstruction.info_ = SuperscalarInstruction::Null;
  currentInstruction.src_ = (int)DAT_00124178;
  currentInstruction.dst_ = DAT_00124178._4_4_;
  this = DecoderBuffer::Default;
  local_934 = 0;
  local_8f0 = registers;
  bVar5 = false;
  local_970 = 0;
  local_944 = 0;
  cycle = 0;
  local_968 = 0;
  local_93c = 0;
  iVar16 = 0;
  local_930 = 0;
  local_940 = 0;
  uVar12 = 0;
LAB_0010fa8d:
  if (((0xa9 < cycle) || (bVar5)) || (0x1ff < (int)local_970)) {
    prog->asicLatencies[4] = 0;
    prog->asicLatencies[5] = 0;
    prog->asicLatencies[6] = 0;
    prog->asicLatencies[7] = 0;
    prog->asicLatencies[0] = 0;
    prog->asicLatencies[1] = 0;
    prog->asicLatencies[2] = 0;
    prog->asicLatencies[3] = 0;
    uVar12 = 0;
    uVar13 = 0;
    if (0 < (int)local_970) {
      uVar13 = (ulong)local_970;
    }
    for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
      bVar1 = prog->programBuffer[uVar12].dst;
      bVar2 = prog->programBuffer[uVar12].src;
      iVar16 = 0;
      if (bVar1 != bVar2) {
        iVar16 = prog->asicLatencies[bVar2] + 1;
      }
      iVar8 = prog->asicLatencies[bVar1] + 1;
      if (iVar8 <= iVar16) {
        iVar8 = iVar16;
      }
      prog->asicLatencies[bVar1] = iVar8;
    }
    iVar16 = 0;
    uVar12 = 0;
    for (uVar13 = 0; uVar13 != 8; uVar13 = uVar13 + 1) {
      if (iVar16 < prog->asicLatencies[uVar13]) {
        uVar12 = uVar13 & 0xffffffff;
        iVar16 = prog->asicLatencies[uVar13];
      }
      prog->cpuLatencies[uVar13] = local_8f0->latency;
      local_8f0 = local_8f0 + 1;
    }
    prog->size = local_970;
    prog->addrReg = (int)uVar12;
    prog->cpuLatency = local_934;
    prog->asicLatency = iVar16;
    prog->codeSize = local_940;
    prog->macroOps = local_930;
    prog->decodeCycles = cycle;
    prog->ipc = (double)local_930 / (double)local_934;
    prog->mulCount = local_944;
    return;
  }
  this = (undefined1 *)
         DecoderBuffer::fetchNext
                   ((DecoderBuffer *)this,(currentInstruction.info_)->type_,cycle,local_944,gen);
  local_938 = 0;
LAB_0010fae1:
  iVar8 = local_938 + 1;
  do {
    if (((DecoderBuffer *)this)->opsCount_ <= local_938) {
LAB_0010febc:
      iVar16 = iVar16 + 1;
      cycle = cycle + 1;
      goto LAB_0010fa8d;
    }
    pMVar11 = ((currentInstruction.info_)->ops_).
              super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)((currentInstruction.info_)->ops_).
                            super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11) >> 5) <=
        (int)uVar12) {
      if (0x1ff < (int)local_970 || bVar5) goto LAB_0010febc;
      SuperscalarInstruction::createForSlot
                (&currentInstruction,gen,((DecoderBuffer *)this)->counts_[local_938],
                 ((DecoderBuffer *)this)->index_,((DecoderBuffer *)this)->opsCount_ == iVar8,
                 local_938 == 0);
      pMVar11 = ((currentInstruction.info_)->ops_).
                super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar12 = 0;
    }
    pSVar6 = currentInstruction.info_;
    iVar15 = (int)uVar12;
    iVar9 = local_93c;
    if (local_93c < iVar16) {
      iVar9 = iVar16;
    }
    if (pMVar11[iVar15].dependent_ == false) {
      iVar9 = iVar16;
    }
    tVar3 = pMVar11[iVar15].uop1_;
    if (tVar3 != 0) {
      tVar4 = pMVar11[iVar15].uop2_;
      iVar18 = iVar9;
      if (tVar4 == 0) {
        iVar9 = scheduleUop<false>(tVar3,&portBusy,iVar9);
      }
      else {
        do {
          if (0xad < iVar18) {
            bVar5 = true;
            goto LAB_0010febc;
          }
          iVar9 = scheduleUop<false>(tVar3,&portBusy,iVar18);
          iVar10 = scheduleUop<false>(tVar4,&portBusy,iVar18);
          iVar18 = iVar18 + 1;
        } while (iVar9 != iVar10);
      }
    }
    if (iVar9 < 0) {
      bVar5 = true;
      goto LAB_0010febc;
    }
    iVar18 = iVar16;
    if (iVar15 == pSVar6->srcOp_) {
      for (iVar10 = 0; iVar10 != -4; iVar10 = iVar10 + -1) {
        bVar7 = SuperscalarInstruction::selectSource(&currentInstruction,iVar9,&registers,gen);
        if (bVar7) {
          iVar18 = iVar16 - iVar10;
          goto LAB_0010fc81;
        }
        iVar9 = iVar9 + 1;
      }
    }
    else {
LAB_0010fc81:
      iVar10 = iVar9;
      if (iVar15 != (currentInstruction.info_)->dstOp_) break;
      for (iVar19 = 0; iVar19 != 4; iVar19 = iVar19 + 1) {
        bVar7 = SuperscalarInstruction::selectDestination
                          (&currentInstruction,iVar9 + iVar19,0 < local_968,&registers,gen);
        iVar10 = iVar9 + iVar19;
        if (bVar7) goto LAB_0010fd0d;
      }
    }
    iVar16 = iVar18 + 4;
    if (0xff < local_968) {
      currentInstruction.canReuse_ = (bool)(undefined1)DAT_00124190;
      currentInstruction.groupParIsSource_ = (bool)DAT_00124190._1_1_;
      currentInstruction.info_ = SuperscalarInstruction::Null;
      currentInstruction.src_ = (int)DAT_00124178;
      currentInstruction.dst_ = DAT_00124178._4_4_;
      currentInstruction.mod_ = _DAT_00124180;
      currentInstruction.imm32_ = DAT_00124180_4;
      currentInstruction.opGroup_ = (SuperscalarInstructionType)uRam0000000000124188;
      currentInstruction.opGroupPar_ = uRam0000000000124188._4_4_;
      goto LAB_0010febc;
    }
    uVar12 = (ulong)((long)((currentInstruction.info_)->ops_).
                           super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)((currentInstruction.info_)->ops_).
                          super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 5;
    local_968 = local_968 + 1;
  } while( true );
LAB_0010fd0d:
  tVar3 = pMVar11[iVar15].uop1_;
  if (tVar3 != 0) {
    tVar4 = pMVar11[iVar15].uop2_;
    iVar9 = iVar10;
    if (tVar4 == 0) {
      iVar10 = scheduleUop<true>(tVar3,&portBusy,iVar10);
    }
    else {
      do {
        if (0xad < iVar9) {
          iVar10 = -1;
          goto LAB_0010fdba;
        }
        iVar10 = scheduleUop<false>(tVar3,&portBusy,iVar9);
        iVar18 = scheduleUop<false>(tVar4,&portBusy,iVar9);
        iVar9 = iVar9 + 1;
      } while (iVar10 != iVar18);
      scheduleUop<true>(tVar3,&portBusy,iVar10);
      scheduleUop<true>(pMVar11[iVar15].uop2_,&portBusy,iVar10);
    }
  }
LAB_0010fdba:
  local_93c = pMVar11[iVar15].latency_ + iVar10;
  if (iVar15 == (currentInstruction.info_)->resultOp_) {
    registers[currentInstruction.dst_].latency = local_93c;
    registers[currentInstruction.dst_].lastOpGroup = currentInstruction.opGroup_;
    registers[currentInstruction.dst_].lastOpPar = currentInstruction.opGroupPar_;
    local_934 = local_93c;
  }
  local_940 = local_940 + pMVar11[iVar15].size_;
  uVar12 = (ulong)(iVar15 + 1U);
  local_930 = local_930 + 1;
  if (0xa9 < iVar10) {
    bVar5 = true;
  }
  local_968 = 0;
  local_938 = iVar8;
  if ((int)((ulong)((long)((currentInstruction.info_)->ops_).
                          super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)((currentInstruction.info_)->ops_).
                         super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl
                         .super__Vector_impl_data._M_start) >> 5) <= (int)(iVar15 + 1U)) {
    lVar14 = (long)(int)local_970;
    prog->programBuffer[lVar14].opcode = (char)(currentInstruction.info_)->type_;
    prog->programBuffer[lVar14].dst = (uint8_t)currentInstruction.dst_;
    uVar17 = (uint8_t)currentInstruction.src_;
    if (currentInstruction.src_ < 0) {
      uVar17 = (uint8_t)currentInstruction.dst_;
    }
    prog->programBuffer[lVar14].src = uVar17;
    prog->programBuffer[lVar14].mod = (uint8_t)currentInstruction.mod_;
    prog->programBuffer[lVar14].imm32 = currentInstruction.imm32_;
    if ((0xd < (uint)(currentInstruction.info_)->type_) ||
       (iVar8 = 1, (0x3808U >> ((currentInstruction.info_)->type_ & 0x1f) & 1) == 0)) {
      iVar8 = 0;
    }
    local_970 = local_970 + 1;
    local_944 = local_944 + iVar8;
    local_968 = 0;
  }
  goto LAB_0010fae1;
}

Assistant:

void generateSuperscalar(SuperscalarProgram& prog, Blake2Generator& gen) {

		ExecutionPort::type portBusy[CYCLE_MAP_SIZE][3];
		memset(portBusy, 0, sizeof(portBusy));
		RegisterInfo registers[8];

		const DecoderBuffer* decodeBuffer = &DecoderBuffer::Default;
		SuperscalarInstruction currentInstruction = SuperscalarInstruction::Null;
		int macroOpIndex = 0;
		int codeSize = 0;
		int macroOpCount = 0;
		int cycle = 0;
		int depCycle = 0;
		int retireCycle = 0;
		bool portsSaturated = false;
		int programSize = 0;
		int mulCount = 0;
		int decodeCycle;
		int throwAwayCount = 0;

		//decode instructions for RANDOMX_SUPERSCALAR_LATENCY cycles or until an execution port is saturated.
		//Each decode cycle decodes 16 bytes of x86 code.
		//Since a decode cycle produces on average 3.45 macro-ops and there are only 3 ALU ports, execution ports are always
		//saturated first. The cycle limit is present only to guarantee loop termination.
		//Program size is limited to SuperscalarMaxSize instructions.
		for (decodeCycle = 0; decodeCycle < RANDOMX_SUPERSCALAR_LATENCY && !portsSaturated && programSize < SuperscalarMaxSize; ++decodeCycle) {

			//select a decode configuration
			decodeBuffer = decodeBuffer->fetchNext(currentInstruction.getType(), decodeCycle, mulCount, gen);
			if (trace) std::cout << "; ------------- fetch cycle " << cycle << " (" << decodeBuffer->getName() << ")" << std::endl;

			int bufferIndex = 0;
			
			//fill all instruction slots in the current decode buffer
			while (bufferIndex < decodeBuffer->getSize()) {
				int topCycle = cycle;

				//if we have issued all macro-ops for the current DefyX instruction, create a new instruction
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					if (portsSaturated || programSize >= SuperscalarMaxSize)
						break;
					//select an instruction so that the first macro-op fits into the current slot
					currentInstruction.createForSlot(gen, decodeBuffer->getCounts()[bufferIndex], decodeBuffer->getIndex(), decodeBuffer->getSize() == bufferIndex + 1, bufferIndex == 0);
					macroOpIndex = 0;
					if (trace) std::cout << "; " << currentInstruction.getInfo().getName() << std::endl;
				}
				const MacroOp& mop = currentInstruction.getInfo().getOp(macroOpIndex);
				if (trace) std::cout << mop.getName() << " ";

				//calculate the earliest cycle when this macro-op (all of its uOPs) can be scheduled for execution
				int scheduleCycle = scheduleMop<false>(mop, portBusy, cycle, depCycle);
				if (scheduleCycle < 0) {
					if (trace) std::cout << "Unable to map operation '" << mop.getName() << "' to execution port (cycle " << cycle << ")" << std::endl;
					//__debugbreak();
					portsSaturated = true;
					break;
				}

				//find a source register (if applicable) that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getSrcOp()) {
					int forward;
					//if no suitable operand is ready, look up to LOOK_FORWARD_CYCLES forward
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectSource(scheduleCycle, registers, gen); ++forward) {
						if (trace) std::cout << "; src STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					//if no register was found, throw the instruction away and try another one
					if (forward == LOOK_FORWARD_CYCLES) {
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - source registers not available for operation " << currentInstruction.getInfo().getName() << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; src = r" << currentInstruction.getSource() << std::endl;
				}
				//find a destination register that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getDstOp()) {
					int forward;
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectDestination(scheduleCycle, throwAwayCount > 0, registers, gen); ++forward) {
						if (trace) std::cout << "; dst STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					if (forward == LOOK_FORWARD_CYCLES) { //throw instruction away
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - destination registers not available" << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; dst = r" << currentInstruction.getDestination() << std::endl;
				}
				throwAwayCount = 0;

				//recalculate when the instruction can be scheduled for execution based on operand availability
				scheduleCycle = scheduleMop<true>(mop, portBusy, scheduleCycle, scheduleCycle);

				//calculate when the result will be ready
				depCycle = scheduleCycle + mop.getLatency();

				//if this instruction writes the result, modify register information
				//  RegisterInfo.latency - which cycle the register will be ready
				//  RegisterInfo.lastOpGroup - the last operation that was applied to the register
				//  RegisterInfo.lastOpPar - the last operation source value (-1 = constant, 0-7 = register)
				if (macroOpIndex == currentInstruction.getInfo().getResultOp()) {
					int dst = currentInstruction.getDestination();
					RegisterInfo& ri = registers[dst];
					retireCycle = depCycle;
					ri.latency = retireCycle;
					ri.lastOpGroup = currentInstruction.getGroup();
					ri.lastOpPar = currentInstruction.getGroupPar();
					if (trace) std::cout << "; RETIRED at cycle " << retireCycle << std::endl;
				}
				codeSize += mop.getSize();
				bufferIndex++;
				macroOpIndex++;
				macroOpCount++;

				//terminating condition
				if (scheduleCycle >= RANDOMX_SUPERSCALAR_LATENCY) {
					portsSaturated = true;
				}
				cycle = topCycle;

				//when all macro-ops of the current instruction have been issued, add the instruction into the program
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					currentInstruction.toInstr(prog(programSize++));
					mulCount += isMultiplication(currentInstruction.getType());
				}
			}
			++cycle;
		}

		double ipc = (macroOpCount / (double)retireCycle);

		memset(prog.asicLatencies, 0, sizeof(prog.asicLatencies));

		//Calculate ASIC latency:
		//Assumes 1 cycle latency for all operations and unlimited parallelization.
		for (int i = 0; i < programSize; ++i) {
			Instruction& instr = prog(i);
			int latDst = prog.asicLatencies[instr.dst] + 1;
			int latSrc = instr.dst != instr.src ? prog.asicLatencies[instr.src] + 1 : 0;
			prog.asicLatencies[instr.dst] = std::max(latDst, latSrc);
		}

		//address register is the register with the highest ASIC latency
		int asicLatencyMax = 0;
		int addressReg = 0;
		for (int i = 0; i < 8; ++i) {
			if (prog.asicLatencies[i] > asicLatencyMax) {
				asicLatencyMax = prog.asicLatencies[i];
				addressReg = i;
			}
			prog.cpuLatencies[i] = registers[i].latency;
		}

		prog.setSize(programSize);
		prog.setAddressRegister(addressReg);

		prog.cpuLatency = retireCycle;
		prog.asicLatency = asicLatencyMax;
		prog.codeSize = codeSize;
		prog.macroOps = macroOpCount;
		prog.decodeCycles = decodeCycle;
		prog.ipc = ipc;
		prog.mulCount = mulCount;
		

		/*if(INFO) std::cout << "; ALU port utilization:" << std::endl;
		if (INFO) std::cout << "; (* = in use, _ = idle)" << std::endl;

		int portCycles = 0;
		for (int i = 0; i < CYCLE_MAP_SIZE; ++i) {
			std::cout << "; " << std::setw(3) << i << " ";
			for (int j = 0; j < 3; ++j) {
				std::cout << (portBusy[i][j] ? '*' : '_');
				portCycles += !!portBusy[i][j];
			}
			std::cout << std::endl;
		}*/
	}